

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

int f1(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  sunrealtype y1;
  sunrealtype y0;
  void *user_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  **(double **)((long)ydot->content + 0x10) = dVar2;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 8) =
       (-dVar1 * dVar1 + 1.0) * 3.0 * dVar2 + -dVar1;
  return 0;
}

Assistant:

static int f1(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype y0, y1;

  y0 = NV_Ith_S(y, 0);
  y1 = NV_Ith_S(y, 1);

  NV_Ith_S(ydot, 0) = y1;
  NV_Ith_S(ydot, 1) = (ONE - SQR(y0)) * P1_ETA * y1 - y0;

  return (0);
}